

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,(unsigned_char)1>(Thread *this)

{
  difference_type __n;
  long lVar1;
  long lVar2;
  Simd<unsigned_char,_(unsigned_char)__x10_> val;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  lVar1 = 0;
  lVar2 = 0;
  do {
    lVar1 = (lVar1 + 1) - (ulong)(*(char *)((long)&local_18 + lVar2) == '\0');
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  Push(this,(Value)ZEXT116(lVar1 != 0));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}